

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDec16.c
# Opt level: O1

int If_CutPerformCheck45(If_Man_t *p,uint *pTruth,int nVars,int nLeaves,char *pStr)

{
  If_Par_t *pIVar1;
  bool bVar2;
  int iVar3;
  long lVar4;
  byte bVar5;
  ulong uVar6;
  uint uVar7;
  ulong uVar8;
  int iVar9;
  ulong uVar10;
  word t;
  bool bVar11;
  word Func1;
  word Func0;
  If_Grp_t R;
  If_Grp_t local_2a;
  
  If_CluCheck(&local_2a,p,(word *)pTruth,nLeaves,0,0,5,4,&R,&Func0,&Func1,(word *)0x0,0);
  if (local_2a.nVars == 0) {
    return 0;
  }
  uVar7 = (uint)R.nVars;
  if (uVar7 < 7) {
    if (R.nVars != '\x06') {
      bVar5 = (byte)(1 << (R.nVars & 0x1fU));
      uVar8 = Func0 & ~(-1L << (bVar5 & 0x3f));
      uVar6 = 0;
      uVar10 = uVar8 << (bVar5 & 0x3f);
      if (R.nVars != '\0') {
        uVar10 = uVar6;
      }
      uVar10 = uVar10 | uVar8;
      uVar8 = uVar10 * 4;
      if (1U < (byte)R.nVars) {
        uVar8 = uVar6;
      }
      iVar3 = 2;
      if (1U < (byte)R.nVars) {
        iVar3 = uVar7 + (uVar7 == 0);
      }
      uVar8 = uVar8 | uVar10;
      uVar10 = uVar8 << 4;
      if (iVar3 != 2) {
        uVar10 = uVar6;
      }
      iVar9 = 3;
      if (iVar3 != 2) {
        iVar9 = iVar3;
      }
      uVar10 = uVar10 | uVar8;
      uVar8 = uVar10 << 8;
      if (iVar9 != 3) {
        uVar8 = uVar6;
      }
      uVar8 = uVar8 | uVar10;
      uVar10 = uVar8 << 0x10;
      if (1 < iVar9 - 3U) {
        uVar10 = uVar6;
      }
      uVar10 = uVar10 | uVar8;
      Func0 = uVar10 << 0x20 | uVar10;
    }
    if ((byte)local_2a.nVars < 7) {
      t = Func1;
      if (local_2a.nVars != 6) {
        uVar8 = Func1 & ~(-1L << ((byte)(1 << (local_2a.nVars & 0x1fU)) & 0x3f));
        uVar6 = 0;
        uVar10 = uVar8 * 4;
        if (local_2a.nVars != 1U) {
          uVar10 = uVar6;
        }
        iVar3 = 2;
        if (local_2a.nVars != 1U) {
          iVar3 = (int)local_2a.nVars + (uint)(local_2a.nVars == 0);
        }
        uVar10 = uVar10 | uVar8;
        uVar8 = uVar10 << 4;
        if (iVar3 != 2) {
          uVar8 = uVar6;
        }
        iVar9 = 3;
        if (iVar3 != 2) {
          iVar9 = iVar3;
        }
        uVar8 = uVar8 | uVar10;
        uVar10 = uVar8 << 8;
        if (iVar9 != 3) {
          uVar10 = uVar6;
        }
        uVar10 = uVar10 | uVar8;
        uVar8 = uVar10 << 0x10;
        if (1 < iVar9 - 3U) {
          uVar8 = uVar6;
        }
        uVar8 = uVar8 | uVar10;
        t = uVar8 << 0x20 | uVar8;
      }
      iVar3 = 1;
      if ('\x04' < local_2a.nVars) {
        pIVar1 = p->pPars;
        if ((pIVar1->fEnableCheck75 != 0) && (Func1 = t, iVar3 = If_CluCheckDecOut(t,5), iVar3 != 0)
           ) {
          return 1;
        }
        if (pIVar1->fEnableCheck75u != 0) {
          lVar4 = 0;
          do {
            bVar2 = (*(ulong *)((long)Truth6 + lVar4) | t) == 0xffffffffffffffff ||
                    (t & ~*(ulong *)((long)Truth6 + lVar4)) == 0;
            if (bVar2) break;
            bVar11 = lVar4 != 0x20;
            lVar4 = lVar4 + 8;
          } while (bVar11);
          if (bVar2) {
            return 1;
          }
        }
        iVar3 = 0;
      }
      return iVar3;
    }
  }
  __assert_fail("nVars >= 0 && nVars <= 6",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifDec16.c"
                ,0x174,"word If_CluAdjust(word, int)");
}

Assistant:

int If_CutPerformCheck45( If_Man_t * p, unsigned * pTruth, int nVars, int nLeaves, char * pStr )
{    
    // 5LUT -> 4LUT
    If_Grp_t G, R;
    word Func0, Func1;
    G = If_CluCheck( p, (word *)pTruth, nLeaves, 0, 0, 5, 4, &R, &Func0, &Func1, NULL, 0 );
    if ( G.nVars == 0 )
        return 0;
    Func0 = If_CluAdjust( Func0, R.nVars );
    Func1 = If_CluAdjust( Func1, G.nVars );
#if 0
    Kit_DsdPrintFromTruth( pTruth, nVars ); printf( "\n" );
    Kit_DsdPrintFromTruth( (unsigned*)&Func0, R.nVars ); printf( "\n" );
    Kit_DsdPrintFromTruth( (unsigned*)&Func1, G.nVars ); printf( "\n" );
    If_CluPrintGroup( &R );
    If_CluPrintGroup( &G );
#endif
    if ( G.nVars < 5 || (p->pPars->fEnableCheck75 && If_CluCheckDecOut(Func1, 5)) || (p->pPars->fEnableCheck75u && If_CluCheckDecOutU(Func1, 5)) )
        return 1;
    return 0;
}